

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O1

bool __thiscall USDFParser::ParsePage(USDFParser *this)

{
  uint uVar1;
  bool bVar2;
  FTextureID FVar3;
  int iVar4;
  FStrifeDialogueNode *pFVar5;
  long lVar6;
  PClassActor *pPVar7;
  char *pcVar8;
  FString *this_00;
  bool block;
  FString Dialogue;
  FString SpeakerName;
  FString soundname;
  FName key;
  FStrifeDialogueReply **replyptr;
  FString local_58;
  FString local_50;
  FString local_48;
  int local_3c;
  FStrifeDialogueReply **local_38;
  
  pFVar5 = (FStrifeDialogueNode *)operator_new(0x48);
  (pFVar5->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
  (pFVar5->ItemCheck).Most = 0;
  (pFVar5->ItemCheck).Count = 0;
  (pFVar5->SpeakerVoice).ID = 0;
  local_38 = &pFVar5->Children;
  pFVar5->SpeakerVoice = 0;
  pFVar5->Backdrop = 0;
  pFVar5->Dialogue = (char *)0x0;
  pFVar5->SpeakerType = (PClassActor *)0x0;
  pFVar5->SpeakerName = (char *)0x0;
  (pFVar5->ItemCheck).Most = 0;
  (pFVar5->ItemCheck).Count = 0;
  pFVar5->ThisNodeNum = 0;
  pFVar5->ItemCheckNode = 0;
  pFVar5->DropType = (PClassActor *)0x0;
  (pFVar5->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
  pFVar5->Children = (FStrifeDialogueReply *)0x0;
  TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Grow(&StrifeDialogues,1);
  StrifeDialogues.Array[StrifeDialogues.Count] = pFVar5;
  uVar1 = StrifeDialogues.Count + 1;
  pFVar5->ThisNodeNum = StrifeDialogues.Count;
  StrifeDialogues.Count = uVar1;
  pFVar5->ItemCheckNode = -1;
  local_50.Chars = FString::NullString.Nothing;
  local_58.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
switchD_00555be0_caseD_1d2:
  bVar2 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar2) {
    pcVar8 = ncopystring(local_50.Chars);
    pFVar5->SpeakerName = pcVar8;
    pcVar8 = ncopystring(local_58.Chars);
    pFVar5->Dialogue = pcVar8;
    FString::~FString(&local_58);
    FString::~FString(&local_50);
    return bVar2;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&stack0xffffffffffffffc4,SUB81(this,0),(bool *)0x1);
  lVar6 = (long)local_3c;
  switch(local_3c) {
  case 0x1cf:
    pcVar8 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    this_00 = &local_50;
    break;
  case 0x1d0:
    pcVar8 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    FVar3 = FTextureManager::CheckForTexture(&TexMan,pcVar8,8,1);
    (pFVar5->Backdrop).texnum = FVar3.texnum;
    goto switchD_00555be0_caseD_1d2;
  case 0x1d1:
    pcVar8 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    this_00 = &local_58;
    break;
  case 0x1d2:
  case 0x1d3:
    goto switchD_00555be0_caseD_1d2;
  case 0x1d4:
    iVar4 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    pFVar5->ItemCheckNode = iVar4;
    goto switchD_00555be0_caseD_1d2;
  default:
    if (local_3c == 0x28) {
      pcVar8 = UDMFParserBase::CheckString
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
      if (*pcVar8 != '\0') {
        FString::FString(&local_48,"svox/");
        FString::operator+=(&local_48,pcVar8);
        iVar4 = S_FindSound(local_48.Chars);
        (pFVar5->SpeakerVoice).ID = iVar4;
        if ((iVar4 == 0) && ((this->super_UDMFParserBase).namespace_bits == 1)) {
          iVar4 = S_FindSound(pcVar8);
          (pFVar5->SpeakerVoice).ID = iVar4;
        }
        FString::~FString(&local_48);
      }
    }
    else if (local_3c == 0xaf) {
      pPVar7 = CheckActorType(this,FName::NameData.NameArray[lVar6].Text);
      pFVar5->DropType = pPVar7;
    }
    goto switchD_00555be0_caseD_1d2;
  }
  FString::operator=(this_00,pcVar8);
  goto switchD_00555be0_caseD_1d2;
}

Assistant:

bool ParsePage()
	{
		FStrifeDialogueNode *node = new FStrifeDialogueNode;
		FStrifeDialogueReply **replyptr = &node->Children;
		memset(node, 0, sizeof(*node));
		//node->ItemCheckCount[0] = node->ItemCheckCount[1] = node->ItemCheckCount[2] = -1;

		node->ThisNodeNum = StrifeDialogues.Push(node);
		node->ItemCheckNode = -1;

		FString SpeakerName;
		FString Dialogue;

		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Name:
					SpeakerName = CheckString(key);
					break;

				case NAME_Panel:
					node->Backdrop = TexMan.CheckForTexture (CheckString(key), FTexture::TEX_MiscPatch);
					break;

				case NAME_Voice:
					{
						const char * name = CheckString(key);
						if (name[0] != 0)
						{
							FString soundname = "svox/";
							soundname += name;
							node->SpeakerVoice = FSoundID(S_FindSound(soundname));
							if (node->SpeakerVoice == 0 && namespace_bits == Zd)
							{
								node->SpeakerVoice = FSoundID(S_FindSound(name));
							}
						}
					}
					break;

				case NAME_Dialog:
					Dialogue = CheckString(key);
					break;

				case NAME_Drop:
					node->DropType = CheckActorType(key);
					break;

				case NAME_Link:
					node->ItemCheckNode = CheckInt(key);
					break;


				}
			}
			else
			{
				switch(key)
				{
				case NAME_Ifitem:
					if (!ParseIfItem(node)) return false;
					break;

				case NAME_Choice:
					if (!ParseChoice(replyptr)) return false;
					break;

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		node->SpeakerName = ncopystring(SpeakerName);
		node->Dialogue = ncopystring(Dialogue);
		return true;
	}